

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_iter.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_22477::
ARTIteratorTest_C101_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTIteratorTest_C101_Test
          (ARTIteratorTest_C101_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTIteratorTest, C101) {
  using Key = typename TypeParam::key_type;
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  constexpr std::uint64_t k0 = 0xaa00;
  constexpr std::uint64_t k1 = 0xaa10;
  constexpr std::uint64_t k2 = 0xab10;
  verifier.insert(k0, unodb::test::test_values[0]);
  verifier.insert(k1, unodb::test::test_values[1]);
  verifier.insert(k2, unodb::test::test_values[2]);
  {    // exact match, forward traversal
    {  // exact match, forward traversal (GTE), first key.
      auto it = db.test_only_iterator();
      bool match = false;
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, forward traversal (GTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, forward traversal (GTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // exact match, reverse traversal
    {  // exact match, reverse traversal (LTE), first key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // exact match, reverse traversal (LTE), middle key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k1)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k1);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[1]));
    }
    {  // exact match, reverse traversal (LTE), last key.
      bool match = false;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(k2)}, match,
              false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_TRUE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
    }
  }
  {    // before and after the first and last key
    {  // forward traversal, before the first key in the data.
      // match=false and iterator is positioned on the first key in the
      // data.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              true /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_EQ(match, false);
      UNODB_EXPECT_EQ(decode(it.get_key()), k0);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[0]));
    }
    {  // forward traversal, after the last key in the data.  match=false
      // and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, true /*fwd*/);
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {  // reverse traversal, before the first key in the data.
      // match=false and iterator is invalidated.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0)}, match,
              false /*fwd*/);
      UNODB_EXPECT_FALSE(it.valid());
      UNODB_EXPECT_FALSE(match);
    }
    {  // reverse traversal, after the last key in the data.  match=false
      // and iterator is positioned at the last key.
      bool match = true;
      auto it = db.test_only_iterator();
      it.seek(unodb::detail::basic_art_key<Key>{verifier.coerce_key(0xffff)},
              match, false /*fwd*/);
      UNODB_EXPECT_TRUE(it.valid());
      UNODB_EXPECT_FALSE(match);
      UNODB_EXPECT_EQ(decode(it.get_key()), k2);
      UNODB_EXPECT_TRUE(
          std::ranges::equal(it.get_val(), unodb::test::test_values[2]));
      it.next();
      UNODB_EXPECT_FALSE(it.valid());  // nothing more in the iterator.
    }
  }
}